

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O2

void __thiscall Jupiter::Config::Config(Config *this,Config *in_config)

{
  this->_vptr_Config = (_func_int **)&PTR_read_internal_0015a148;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_table)._M_h._M_buckets = &(this->m_table)._M_h._M_single_bucket;
  (this->m_table)._M_h._M_bucket_count = 1;
  (this->m_table)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_table)._M_h._M_element_count = 0;
  (this->m_table)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_table)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_table)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  make_unique<std::unordered_map<std::__cxx11::string,Jupiter::Config,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>>,std::unordered_map<std::__cxx11::string,Jupiter::Config,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>>&>
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
              *)&this->m_sections);
  return;
}

Assistant:

Jupiter::Config::Config(const Config& in_config)
	: m_sections{ std::make_unique<SectionHashTable>(*in_config.m_sections) } {
}